

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
* __thiscall
fasttext::Meter::getPositiveCounts
          (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  float fVar1;
  pointer ppVar2;
  pointer ppVar3;
  __normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  __tmp;
  double dVar4;
  uint64_t falsePositives;
  uint64_t truePositives;
  unsigned_long local_50;
  unsigned_long local_48;
  double local_40;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scoreVsTrue(&local_38,this,labelId);
  local_48 = 0;
  local_50 = 0;
  if ((local_38.
       super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish !=
       local_38.
       super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (fVar1 = local_38.
              super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].first, 0.0 <= fVar1)) {
    local_40 = -2.0;
    ppVar3 = local_38.
             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      if ((ppVar3[-1].second != 1.0) || (NAN(ppVar3[-1].second))) {
        local_50 = local_50 + 1;
      }
      else {
        local_48 = local_48 + 1;
      }
      dVar4 = (double)fVar1;
      if (((local_40 != dVar4) || (NAN(local_40) || NAN(dVar4))) ||
         (ppVar2 = (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
         ppVar2 == (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)) {
        local_40 = dVar4;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)__return_storage_ptr__,&local_48,&local_50);
      }
      else {
        ppVar2[-1].first = local_48;
        ppVar2[-1].second = local_50;
        local_40 = dVar4;
      }
      if (ppVar3 + -1 ==
          local_38.
          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) break;
      fVar1 = ppVar3[-2].first;
      ppVar3 = ppVar3 + -1;
    } while (0.0 <= fVar1);
  }
  if (local_38.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint64_t, uint64_t>> Meter::getPositiveCounts(
    int32_t labelId) const {
  std::vector<std::pair<uint64_t, uint64_t>> positiveCounts;

  const auto& v = scoreVsTrue(labelId);
  uint64_t truePositives = 0;
  uint64_t falsePositives = 0;
  double lastScore = falseNegativeScore - 1.0;

  for (auto it = v.rbegin(); it != v.rend(); ++it) {
    double score = it->first;
    double gold = it->second;
    if (score < 0) { // only reachable recall
      break;
    }
    if (gold == 1.0) {
      truePositives++;
    } else {
      falsePositives++;
    }
    if (score == lastScore && positiveCounts.size()) { // squeeze tied scores
      positiveCounts.back() = {truePositives, falsePositives};
    } else {
      positiveCounts.emplace_back(truePositives, falsePositives);
    }
    lastScore = score;
  }

  return positiveCounts;
}